

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

size_t ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  uint in_EDI;
  size_t local_8;
  
  if (g_thread_affinity_mask_all == 0) {
    setup_thread_affinity_masks();
  }
  if (g_thread_affinity_mask_little == 0) {
    local_8 = g_thread_affinity_mask_all;
  }
  else if (in_EDI == 0) {
    local_8 = g_thread_affinity_mask_all;
  }
  else if (in_EDI == 1) {
    local_8 = g_thread_affinity_mask_little;
  }
  else if (in_EDI == 2) {
    local_8 = g_thread_affinity_mask_big;
  }
  else {
    fprintf(_stderr,"powersave %d not supported",(ulong)in_EDI);
    fprintf(_stderr,"\n");
    local_8 = g_thread_affinity_mask_all;
  }
  return local_8;
}

Assistant:

size_t get_cpu_thread_affinity_mask(int powersave)
{
    if (g_thread_affinity_mask_all == 0)
    {
        setup_thread_affinity_masks();
    }

    if (g_thread_affinity_mask_little == 0)
    {
        // SMP cpu powersave not supported
        // fallback to all cores anyway
        return g_thread_affinity_mask_all;
    }

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}